

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O3

void __thiscall mognetwork::Selector::setFds(Selector *this)

{
  __fd_mask *p_Var1;
  int iVar2;
  _List_node_base *p_Var3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  memset(&this->m_rdfs,0,0x104);
  p_Var3 = (this->m_readSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->m_readSockets) {
    iVar4 = 0;
    do {
      iVar2 = *(int *)&p_Var3[1]._M_next;
      iVar5 = iVar2 + 0x3f;
      if (-1 < iVar2) {
        iVar5 = iVar2;
      }
      p_Var1 = (this->m_rdfs).fds_bits + (iVar5 >> 6);
      *p_Var1 = *p_Var1 | 1L << ((byte)iVar2 & 0x3f);
      if (iVar4 < iVar2) {
        iVar4 = *(int *)&p_Var3[1]._M_next;
      }
      this->m_maxFds = iVar4;
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->m_readSockets);
  }
  for (p_Var3 = (this->m_writeSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                super__List_node_base._M_next; p_Var3 != (_List_node_base *)&this->m_writeSockets;
      p_Var3 = p_Var3->_M_next) {
    iVar2 = *(int *)&p_Var3[1]._M_next;
    iVar5 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar5 = iVar2;
    }
    p_Var1 = (this->m_wdfs).fds_bits + (iVar5 >> 6);
    *p_Var1 = *p_Var1 | 1L << ((byte)iVar2 & 0x3f);
    if (iVar4 < iVar2) {
      iVar4 = *(int *)&p_Var3[1]._M_next;
    }
    this->m_maxFds = iVar4;
  }
  return;
}

Assistant:

void Selector::setFds()
  {
    m_maxFds = 0;
    FD_ZERO(&m_rdfs);
    FD_ZERO(&m_wdfs);

    for (std::list<SocketFD>::iterator it = m_readSockets.begin();
	 it != m_readSockets.end(); ++it)
      {
	FD_SET(*it, &m_rdfs);
	m_maxFds = std::max(m_maxFds, *it);
      }

    for (std::list<SocketFD>::iterator it = m_writeSockets.begin();
	 it != m_writeSockets.end(); ++it)
      {
	FD_SET(*it, &m_wdfs);
	m_maxFds = std::max(m_maxFds, *it);
      }
  }